

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,token *value)

{
  bool bVar1;
  ostream *poVar2;
  string s;
  StringData sdata;
  string local_1d8;
  string local_1b8;
  StringData local_198 [7];
  
  local_198[0].value._M_dataplus._M_p = (pointer)&local_198[0].value.field_2;
  local_198[0].value._M_string_length = 0;
  local_198[0].value.field_2._M_local_buf[0] = '\0';
  local_198[0].is_triple_quoted = false;
  local_198[0].single_quote = false;
  local_198[0].line_row = 0;
  local_198[0].line_col = 0;
  bVar1 = MaybeTripleQuotedString(this,local_198);
  if (bVar1) {
    Token::Token((Token *)&local_1d8,&local_198[0].value);
    ::std::__cxx11::string::operator=((string *)value,(string *)&local_1d8);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    bVar1 = true;
  }
  else {
    ::std::__cxx11::string::_M_dispose();
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    local_1d8._M_string_length = 0;
    local_1d8.field_2._M_local_buf[0] = '\0';
    bVar1 = ReadStringLiteral(this,&local_1d8);
    if (bVar1) {
      Token::Token((Token *)local_198,&local_1d8);
      ::std::__cxx11::string::operator=((string *)value,(string *)local_198);
      ::std::__cxx11::string::_M_dispose();
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      poVar2 = ::std::operator<<((ostream *)local_198,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-basetype.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,"[ASCII]");
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ReadBasicType");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x280);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)local_198,"Failed to parse string literal.");
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::stringbuf::str();
      PushError(this,&local_1b8);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    }
    ::std::__cxx11::string::_M_dispose();
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(value::token *value) {
  // Try triple-quotated string first.
  {
    value::StringData sdata;
    if (MaybeTripleQuotedString(&sdata)) {
      // TODO: preserve quotation info.
      (*value) = value::token(sdata.value);
      return true;
    }
  }

  std::string s;
  if (!ReadStringLiteral(&s)) {
    PUSH_ERROR_AND_RETURN_TAG(kAscii, "Failed to parse string literal.");
    return false;
  }

  (*value) = value::token(s);
  return true;
}